

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O0

void __thiscall EefcFlash::writePage(EefcFlash *this,uint32_t page)

{
  uint8_t uVar1;
  FlashPageError *this_00;
  uint32_t local_44;
  uint32_t page_local;
  EefcFlash *this_local;
  
  if ((this->super_Flash)._pages <= page) {
    this_00 = (FlashPageError *)__cxa_allocate_exception(8);
    FlashPageError::FlashPageError(this_00);
    __cxa_throw(this_00,&FlashPageError::typeinfo,FlashPageError::~FlashPageError);
  }
  WordCopyApplet::setDstAddr
            (&(this->super_Flash)._wordCopy,
             (this->super_Flash)._addr + page * (this->super_Flash)._size);
  if (((this->super_Flash)._onBufferA & 1U) == 0) {
    local_44 = (this->super_Flash)._pageBufferB;
  }
  else {
    local_44 = (this->super_Flash)._pageBufferA;
  }
  WordCopyApplet::setSrcAddr(&(this->super_Flash)._wordCopy,local_44);
  (this->super_Flash)._onBufferA = (bool)(((this->super_Flash)._onBufferA ^ 0xffU) & 1);
  waitFSR(this,1);
  Applet::runv(&(this->super_Flash)._wordCopy.super_Applet);
  if (((this->super_Flash)._planes == 2) && ((this->super_Flash)._pages >> 1 <= page)) {
    uVar1 = '\x01';
    if ((this->_eraseAuto & 1U) != 0) {
      uVar1 = '\x03';
    }
    writeFCR1(this,uVar1,page - ((this->super_Flash)._pages >> 1));
  }
  else {
    uVar1 = '\x01';
    if ((this->_eraseAuto & 1U) != 0) {
      uVar1 = '\x03';
    }
    writeFCR0(this,uVar1,page);
  }
  return;
}

Assistant:

void
EefcFlash::writePage(uint32_t page)
{
    if (page >= _pages)
        throw FlashPageError();

    _wordCopy.setDstAddr(_addr + page * _size);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _onBufferA = !_onBufferA;
    waitFSR();
    _wordCopy.runv();
    if (_planes == 2 && page >= _pages / 2)
        writeFCR1(_eraseAuto ? EEFC_FCMD_EWP : EEFC_FCMD_WP, page - _pages / 2);
    else
        writeFCR0(_eraseAuto ? EEFC_FCMD_EWP : EEFC_FCMD_WP, page);
}